

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QTextCursor>::detachAndGrow
          (QArrayDataPointer<QTextCursor> *this,GrowthPosition where,qsizetype n,QTextCursor **data,
          QArrayDataPointer<QTextCursor> *old)

{
  Data *pDVar1;
  bool bVar2;
  long lVar3;
  
  pDVar1 = this->d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
  goto LAB_004e19b5;
  if (n == 0) {
    return;
  }
  if (where == GrowsAtEnd) {
    if (pDVar1 == (Data *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (pDVar1->super_QArrayData).alloc -
              (((long)((long)this->ptr -
                      ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) + this->size);
    }
joined_r0x004e1a2c:
    if (n <= lVar3) {
      return;
    }
  }
  else if (where == GrowsAtBeginning) {
    if (pDVar1 == (Data *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (long)((long)this->ptr -
                    ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
              3;
    }
    goto joined_r0x004e1a2c;
  }
  bVar2 = tryReadjustFreeSpace(this,where,n,data);
  if (bVar2) {
    return;
  }
LAB_004e19b5:
  reallocateAndGrow(this,where,n,old);
  return;
}

Assistant:

void detachAndGrow(QArrayData::GrowthPosition where, qsizetype n, const T **data,
                       QArrayDataPointer *old)
    {
        const bool detach = needsDetach();
        bool readjusted = false;
        if (!detach) {
            if (!n || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n))
                return;
            readjusted = tryReadjustFreeSpace(where, n, data);
            Q_ASSERT(!readjusted
                     || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                     || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n));
        }

        if (!readjusted)
            reallocateAndGrow(where, n, old);
    }